

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O0

void __thiscall SubtableSymbol::buildDecisionTree(SubtableSymbol *this,DecisionProperties *props)

{
  int iVar1;
  DecisionNode *pDVar2;
  size_type sVar3;
  reference ppCVar4;
  TokenPattern *this_00;
  Pattern *pat_00;
  undefined4 extraout_var;
  uint local_34;
  int local_30;
  int4 j;
  int4 i;
  Pattern *pat;
  DecisionProperties *props_local;
  SubtableSymbol *this_local;
  
  if (this->pattern != (TokenPattern *)0x0) {
    pDVar2 = (DecisionNode *)operator_new(0x48);
    DecisionNode::DecisionNode(pDVar2,(DecisionNode *)0x0);
    this->decisiontree = pDVar2;
    for (local_30 = 0;
        sVar3 = std::vector<Constructor_*,_std::allocator<Constructor_*>_>::size(&this->construct),
        (ulong)(long)local_30 < sVar3; local_30 = local_30 + 1) {
      ppCVar4 = std::vector<Constructor_*,_std::allocator<Constructor_*>_>::operator[]
                          (&this->construct,(long)local_30);
      this_00 = Constructor::getPattern(*ppCVar4);
      pat_00 = TokenPattern::getPattern(this_00);
      iVar1 = (*pat_00->_vptr_Pattern[8])();
      if (iVar1 == 0) {
        pDVar2 = this->decisiontree;
        ppCVar4 = std::vector<Constructor_*,_std::allocator<Constructor_*>_>::operator[]
                            (&this->construct,(long)local_30);
        DecisionNode::addConstructorPair(pDVar2,(DisjointPattern *)pat_00,*ppCVar4);
      }
      else {
        for (local_34 = 0; iVar1 = (*pat_00->_vptr_Pattern[8])(), (int)local_34 < iVar1;
            local_34 = local_34 + 1) {
          pDVar2 = this->decisiontree;
          iVar1 = (*pat_00->_vptr_Pattern[9])(pat_00,(ulong)local_34);
          ppCVar4 = std::vector<Constructor_*,_std::allocator<Constructor_*>_>::operator[]
                              (&this->construct,(long)local_30);
          DecisionNode::addConstructorPair
                    (pDVar2,(DisjointPattern *)CONCAT44(extraout_var,iVar1),*ppCVar4);
        }
      }
    }
    DecisionNode::split(this->decisiontree,props);
  }
  return;
}

Assistant:

void SubtableSymbol::buildDecisionTree(DecisionProperties &props)

{				// Associate pattern disjoints to constructors
  if (pattern == (TokenPattern *)0) return; // Pattern not fully formed
  Pattern *pat;
  decisiontree = new DecisionNode((DecisionNode *)0);
  for(int4 i=0;i<construct.size();++i) {
    pat = construct[i]->getPattern()->getPattern();
    if (pat->numDisjoint() == 0)
      decisiontree->addConstructorPair((const DisjointPattern *)pat,construct[i]);
    else
      for(int4 j=0;j<pat->numDisjoint();++j)
	decisiontree->addConstructorPair(pat->getDisjoint(j),construct[i]);
  }
  decisiontree->split(props);	// Create the decision strategy
}